

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::GetTransitionType
          (TimeZoneInfo *this,int_fast32_t utc_offset,bool is_dst,string *abbr,uint_least8_t *index)

{
  string *psVar1;
  pointer pTVar2;
  const_iterator __position;
  bool bVar3;
  iterator iVar4;
  ulong uVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  
  psVar1 = &this->abbreviations_;
  sVar6 = (this->abbreviations_)._M_string_length;
  lVar7 = 0x29;
  for (uVar5 = 0;
      pTVar2 = (this->transition_types_).
               super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar8 = sVar6,
      uVar5 != ((long)(this->transition_types_).
                      super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x30;
      uVar5 = uVar5 + 1) {
    bVar3 = std::operator==((psVar1->_M_dataplus)._M_p +
                            *(byte *)((long)&pTVar2->utc_offset + lVar7),abbr);
    uVar8 = (ulong)*(byte *)((long)&pTVar2->utc_offset + lVar7);
    if (bVar3) {
      sVar6 = uVar8;
    }
    if (((*(int *)((long)pTVar2 + lVar7 + -0x29) == utc_offset) &&
        ((bool)*(char *)((long)pTVar2 + lVar7 + -1) == is_dst)) && (sVar6 == uVar8)) break;
    lVar7 = lVar7 + 0x30;
  }
  if (uVar8 < 0x100 && uVar5 < 0x100) {
    __position._M_current =
         (this->transition_types_).
         super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current -
        (long)(this->transition_types_).
              super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30 == uVar5) {
      iVar4 = std::
              vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              ::_M_emplace_aux<>(&this->transition_types_,__position);
      (iVar4._M_current)->utc_offset = (int_least32_t)utc_offset;
      (iVar4._M_current)->is_dst = is_dst;
      if (uVar8 == (this->abbreviations_)._M_string_length) {
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::append((ulong)psVar1,'\x01');
      }
      (iVar4._M_current)->abbr_index = (uint_least8_t)uVar8;
    }
    *index = (uint_least8_t)uVar5;
  }
  return uVar8 < 0x100 && uVar5 < 0x100;
}

Assistant:

bool TimeZoneInfo::GetTransitionType(std::int_fast32_t utc_offset, bool is_dst,
                                     const std::string& abbr,
                                     std::uint_least8_t* index) {
  std::size_t type_index = 0;
  std::size_t abbr_index = abbreviations_.size();
  for (; type_index != transition_types_.size(); ++type_index) {
    const TransitionType& tt(transition_types_[type_index]);
    const char* tt_abbr = &abbreviations_[tt.abbr_index];
    if (tt_abbr == abbr) abbr_index = tt.abbr_index;
    if (tt.utc_offset == utc_offset && tt.is_dst == is_dst) {
      if (abbr_index == tt.abbr_index) break;  // reuse
    }
  }
  if (type_index > 255 || abbr_index > 255) {
    // No index space (8 bits) available for a new type or abbreviation.
    return false;
  }
  if (type_index == transition_types_.size()) {
    TransitionType& tt(*transition_types_.emplace(transition_types_.end()));
    tt.utc_offset = static_cast<std::int_least32_t>(utc_offset);
    tt.is_dst = is_dst;
    if (abbr_index == abbreviations_.size()) {
      abbreviations_.append(abbr);
      abbreviations_.append(1, '\0');
    }
    tt.abbr_index = static_cast<std::uint_least8_t>(abbr_index);
  }
  *index = static_cast<std::uint_least8_t>(type_index);
  return true;
}